

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::set_value
          (tag_scalar_vector_t<int,_cfgfile::string_trait_t> *this,int *v)

{
  constraint_t<int> *pcVar1;
  int iVar2;
  exception_t<cfgfile::string_trait_t> *this_00;
  int *value;
  allocator<char> local_183;
  allocator<char> local_182;
  allocator<char> local_181;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string_t local_100;
  string local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<int> *)0x0) {
    iVar2 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,v);
    if ((char)iVar2 == '\0') {
      this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"Invalid value: \"",&local_181);
      std::__cxx11::string::string((string *)&local_c0,local_e0);
      format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_
                (&local_100,(format_t<int,cfgfile::string_trait_t> *)v,value);
      std::operator+(&local_a0,&local_c0,&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"\". Value must match to the constraint in tag \"",&local_182);
      std::__cxx11::string::string((string *)&local_120,local_140);
      std::operator+(&local_80,&local_a0,&local_120);
      std::operator+(&local_60,&local_80,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      std::__cxx11::string::string<std::allocator<char>>(local_180,"\".",&local_183);
      std::__cxx11::string::string((string *)&local_160,local_180);
      std::operator+(&local_40,&local_60,&local_160);
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_40);
      __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->m_values,v);
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
  return;
}

Assistant:

void
	set_value( const T & v )
	{
		if( m_constraint )
		{
			if( !m_constraint->check( v ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t(
						format_t< T, Trait >::to_string( v ) ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\"." ) );
		}

		m_values.push_back( v );

		this->set_defined();
	}